

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O2

void free_erased(vmd_bst_t *tree,vmd_bst_rev_t *rev)

{
  void *pvVar1;
  ulong uVar2;
  long lVar3;
  
  if (rev->erased != (vmd_bst_node_t **)0x0) {
    if (rev->erased_data == (void *)0x0) {
      uVar2 = (ulong)rev->erased_count;
      pvVar1 = malloc(uVar2 * tree->csize);
      rev->erased_data = pvVar1;
      for (lVar3 = 0; lVar3 < (int)uVar2; lVar3 = lVar3 + 1) {
        memcpy((void *)(tree->csize * lVar3 + (long)rev->erased_data),
               &rev->erased[lVar3]->field_0x21,tree->csize);
        uVar2 = (ulong)(uint)rev->erased_count;
      }
    }
    for (lVar3 = 0; lVar3 < rev->erased_count; lVar3 = lVar3 + 1) {
      dlist_insert(&tree->free,rev->erased[lVar3]);
    }
  }
  return;
}

Assistant:

static void
free_erased(bst_t *tree, bst_rev_t *rev)
{
	int i;
	if (rev->erased == NULL)
		return;

	if (rev->erased_data == NULL) {
		rev->erased_data = malloc(tree->csize * rev->erased_count);
		for (i = 0; i < rev->erased_count; i++)
			memcpy(rev->erased_data + i * tree->csize, rev->erased[i]->data, tree->csize);
	}

	for (i = 0; i < rev->erased_count; i++)
		dlist_insert(&tree->free, rev->erased[i]);
}